

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O3

Bytes * __thiscall
SSM::ECUPort::buildReadRequest
          (Bytes *__return_storage_ptr__,ECUPort *this,Observables *observables,bool continuous)

{
  void *pvVar1;
  undefined7 in_register_00000009;
  ulong uVar2;
  char *pcVar3;
  Bytes *__range1;
  long lVar4;
  array<std::byte,_3UL> *addr;
  undefined8 *puVar5;
  void *pvVar6;
  void *pvVar7;
  initializer_list<std::byte> __l;
  Bytes addresses;
  allocator_type local_79;
  void *local_78;
  iterator iStack_70;
  byte *local_68;
  uint local_5c;
  byte local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  char cStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined2 uStack_52;
  void *local_50;
  long local_48;
  vector<std::byte,std::allocator<std::byte>> *local_40;
  undefined8 *local_38;
  
  uVar2 = CONCAT71(in_register_00000009,continuous);
  local_78 = (void *)0x0;
  iStack_70._M_current = (byte *)0x0;
  local_68 = (byte *)0x0;
  puVar5 = *(undefined8 **)observables;
  local_38 = *(undefined8 **)(observables + 8);
  if (puVar5 == local_38) {
    cStack_55 = '\x02';
  }
  else {
    local_5c = (uint)uVar2;
    local_40 = (vector<std::byte,std::allocator<std::byte>> *)__return_storage_ptr__;
    do {
      (**(code **)(*(long *)*puVar5 + 0x10))(&local_58);
      pvVar1 = local_50;
      pvVar7 = (void *)CONCAT26(uStack_52,
                                CONCAT15(uStack_53,
                                         CONCAT14(uStack_54,
                                                  CONCAT13(cStack_55,
                                                           CONCAT12(uStack_56,
                                                                    CONCAT11(uStack_57,local_58)))))
                               );
      if (pvVar7 != local_50) {
        do {
          pvVar6 = (void *)((long)pvVar7 + 3);
          lVar4 = 0;
          do {
            if (iStack_70._M_current == local_68) {
              std::vector<std::byte,std::allocator<std::byte>>::_M_realloc_insert<std::byte_const&>
                        ((vector<std::byte,std::allocator<std::byte>> *)&local_78,iStack_70,
                         (byte *)((long)pvVar7 + lVar4));
            }
            else {
              *iStack_70._M_current = *(byte *)((long)pvVar7 + lVar4);
              iStack_70._M_current = iStack_70._M_current + 1;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 3);
          pvVar7 = pvVar6;
        } while (pvVar6 != pvVar1);
        pvVar7 = (void *)CONCAT26(uStack_52,
                                  CONCAT15(uStack_53,
                                           CONCAT14(uStack_54,
                                                    CONCAT13(cStack_55,
                                                             CONCAT12(uStack_56,
                                                                      CONCAT11(uStack_57,local_58)))
                                                   )));
      }
      if (pvVar7 != (void *)0x0) {
        operator_delete(pvVar7,local_48 - (long)pvVar7);
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_38);
    cStack_55 = ((char)iStack_70._M_current - (char)local_78) + '\x02';
    uVar2 = (ulong)local_5c;
    __return_storage_ptr__ = (Bytes *)local_40;
  }
  local_58 = 0x80;
  uStack_57 = 0x10;
  uStack_56 = 0xf0;
  uStack_54 = 0xa8;
  uStack_53 = (undefined1)uVar2;
  __l._M_len = 6;
  __l._M_array = &local_58;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector(__return_storage_ptr__,__l,&local_79);
  std::vector<std::byte,std::allocator<std::byte>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::byte*,std::vector<std::byte,std::allocator<std::byte>>>>
            ((vector<std::byte,std::allocator<std::byte>> *)__return_storage_ptr__,
             *(undefined8 *)((long)__return_storage_ptr__ + 8),local_78,iStack_70._M_current);
  local_58 = 0;
  for (pcVar3 = *(char **)__return_storage_ptr__;
      pcVar3 != *(char **)((long)__return_storage_ptr__ + 8); pcVar3 = pcVar3 + 1) {
    local_58 = local_58 + *pcVar3;
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::emplace_back<std::byte>
            (__return_storage_ptr__,&local_58);
  if (local_78 != (void *)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  return (Bytes *)(vector<std::byte,std::allocator<std::byte>> *)__return_storage_ptr__;
}

Assistant:

Bytes ECUPort::buildReadRequest(const Observables& observables,
				  bool continuous) const
  {
    // Add all read addresses to a byte vector
    Bytes addresses;
    for(const auto& obs : observables)
      for(const auto& addr: obs->addresses())
	for(const auto& addr_byte: addr)
	  addresses.push_back(addr_byte);
    
    // Build the header of read request. Datasize is number of
    // addresses plus 2 since READ and CONTIN_RESP/SINGLE_RESP bytes
    // are to be included (not the checksum byte though)
    Bytes request = { HEADER, ECU, TOOL, Byte(addresses.size()+2), READ,
		      (continuous ? CONTIN_RESP : SINGLE_RESP) };
    
    // Attach the addresses to read
    request.insert(request.end(), addresses.begin(), addresses.end());

    // Add the checksum byte and return
    request.push_back(checksum(request));
    return request;
  }